

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

void Abc_SuppGenProfile(Vec_Wrd_t *p,int nBits,int *pCounts)

{
  word *pwVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = p->nSize;
  if (0 < iVar5) {
    pwVar1 = p->pArray;
    lVar4 = 0;
    do {
      uVar2 = pwVar1[lVar4];
      if (0 < nBits) {
        uVar3 = 0;
        do {
          pCounts[uVar3] =
               pCounts[uVar3] +
               (((uint)(uVar2 >> ((byte)uVar3 & 0x3f)) ^ (uint)(uVar2 >> ((byte)nBits & 0x3f))) & 1)
          ;
          uVar3 = uVar3 + 1;
        } while ((uint)nBits != uVar3);
        iVar5 = p->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar5);
  }
  return;
}

Assistant:

void Abc_SuppGenProfile( Vec_Wrd_t * p, int nBits, int * pCounts )
{
    word Ent;
    int i, k, b;
    Vec_WrdForEachEntry( p, Ent, i )
        for ( b = ((Ent >> nBits) & 1), k = 0; k < nBits; k++ )
            pCounts[k] += ((Ent >> k) & 1) ^ b;
}